

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O0

string * __thiscall
punky::obj::inspect_abi_cxx11_(string *__return_storage_ptr__,obj *this,Object *obj)

{
  int *piVar1;
  bool *pbVar2;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  FunctionObject *this_00;
  FunctionLiteral *pFVar4;
  Object *obj_00;
  allocator<char> local_73;
  allocator<char> local_72;
  allocator<char> local_71;
  any local_70;
  Object local_60;
  allocator<char> local_19;
  obj *local_18;
  Object *obj_local;
  
  local_18 = this;
  obj_local = (Object *)__return_storage_ptr__;
  switch(*(undefined4 *)this) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"null",&local_72);
    std::allocator<char>::~allocator(&local_72);
    break;
  case 1:
    piVar1 = std::
             get<int,std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>
                       ((variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                         *)(this + 8));
    std::__cxx11::to_string(__return_storage_ptr__,*piVar1);
    break;
  case 2:
    pbVar2 = std::
             get<bool,std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>
                       ((variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                         *)(this + 8));
    __s = "false";
    if ((*pbVar2 & 1U) != 0) {
      __s = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_19);
    std::allocator<char>::~allocator(&local_19);
    break;
  case 3:
    std::any::
    any<punky::obj::Object_const&,punky::obj::Object,std::any::_Manager_external<punky::obj::Object>,void>
              (&local_70,(Object *)this);
    std::any_cast<punky::obj::Object>(&local_60,&local_70);
    inspect_abi_cxx11_(__return_storage_ptr__,(obj *)&local_60,obj_00);
    Object::~Object(&local_60);
    std::any::~any(&local_70);
    break;
  case 4:
    pbVar3 = std::
             get<std::__cxx11::string,std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>
                       ((variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                         *)(this + 8));
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar3);
    break;
  case 5:
    this_00 = std::
              get<punky::obj::FunctionObject,std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>
                        ((variant<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                          *)(this + 8));
    pFVar4 = FunctionObject::fn(this_00);
    (*(pFVar4->super_ExprNode).super_AstNode._vptr_AstNode[3])(__return_storage_ptr__);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_71);
    std::allocator<char>::~allocator(&local_71);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Default",&local_73);
    std::allocator<char>::~allocator(&local_73);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string inspect(const Object& obj)
{
    switch (obj.m_type)
    {
        case ObjectType::Int:
            return std::to_string(std::get<int>(obj.m_value));

        case ObjectType::Boolean:
            return std::get<bool>(obj.m_value) ? "true" : "false";

        case ObjectType::Return:
            return inspect(std::any_cast<Object>(obj));

        case ObjectType::Error:
            return std::get<std::string>(obj.m_value);

        case ObjectType::Function:
            return std::get<FunctionObject>(obj.m_value).fn()->to_string();

        case ObjectType::EmptyOut:
            return "";

        case ObjectType::Null:
            return "null";

        default:
            return "Default";
    }
}